

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

void Sbd_CutAddUnit(Sbd_Sto_t *p,int iObj)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *vThis;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  p_00 = Vec_WecEntry(p->vCuts,iObj);
  iVar1 = Vec_IntSize(p_00);
  if (iVar1 == 0) {
    Vec_IntPush(p_00,1);
  }
  else {
    Vec_IntAddToEntry(p_00,0,1);
  }
  Vec_IntPush(p_00,1);
  Vec_IntPush(p_00,iObj);
  Vec_IntPush(p_00,2);
  return;
}

Assistant:

static inline void Sbd_CutAddUnit( Sbd_Sto_t * p, int iObj )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    if ( Vec_IntSize(vThis) == 0 )
        Vec_IntPush( vThis, 1 );
    else 
        Vec_IntAddToEntry( vThis, 0, 1 );
    Vec_IntPush( vThis, 1 );
    Vec_IntPush( vThis, iObj );
    Vec_IntPush( vThis, 2 );
}